

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseStateVariables(Parser *this,ScannedTopLevelItem *item)

{
  bool bVar1;
  UTF8Reader local_40;
  reference local_38;
  UTF8Reader *g;
  iterator __end3;
  iterator __begin3;
  vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *__range3;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  prepareToRescan(this,item);
  bVar1 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::empty
                    (&item->stateVariableDecls);
  if (!bVar1) {
    __end3 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::begin
                       (&item->stateVariableDecls);
    g = (UTF8Reader *)
        std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::end
                  (&item->stateVariableDecls);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::UTF8Reader_*,_std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>_>
                                       *)&g), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<soul::UTF8Reader_*,_std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>_>
                 ::operator*(&__end3);
      UTF8Reader::UTF8Reader(&local_40,local_38);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_40);
      parseStateVariable(this);
      __gnu_cxx::
      __normal_iterator<soul::UTF8Reader_*,_std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>_>
      ::operator++(&__end3);
    }
  }
  pool_ptr<soul::Module>::reset(&this->module);
  return;
}

Assistant:

void parseStateVariables (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);

        if (! item.stateVariableDecls.empty())
        {
            for (auto& g : item.stateVariableDecls)
            {
                resetPosition (g);
                parseStateVariable();
            }
        }

        module.reset();
    }